

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncTraits.h
# Opt level: O0

int luabridge::detail::Invoke<int,void,1>::run<int(*)()>(lua_State *L,_func_int **fn)

{
  int value;
  exception *e;
  ArgList<void,_1> local_21;
  _func_int **pp_Stack_20;
  ArgList<void,_1> args;
  _func_int **fn_local;
  lua_State *L_local;
  
  pp_Stack_20 = fn;
  ArgList<void,_1>::ArgList(&local_21,L);
  value = FuncTraits<int_(*)(),_int_(*)()>::call(pp_Stack_20,(TypeListValues<void> *)&local_21);
  Stack<int>::push(L,value);
  return 1;
}

Assistant:

static int run(lua_State* L, Fn& fn)
    {
        try
        {
            ArgList<Params, startParam> args(L);
            Stack<ReturnType>::push(L, FuncTraits<Fn>::call(fn, args));
            return 1;
        }
        catch (const std::exception& e)
        {
            return luaL_error(L, e.what());
        }
    }